

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall tcu::operator+(tcu *this,Matrix<float,_2,_2> *mtx,float scalar)

{
  float *pfVar1;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar2;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar3;
  undefined4 local_28;
  undefined4 local_24;
  int row;
  int col;
  float scalar_local;
  Matrix<float,_2,_2> *mtx_local;
  Matrix<float,_2,_2> *res;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar2.m_data = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      pfVar1 = Matrix<float,_2,_2>::operator()(mtx,local_28,local_24);
      in_XMM1_Qa.m_data[1] = 0.0;
      in_XMM1_Qa.m_data[0] = scalar;
      VVar2.m_data[0] = *pfVar1 + scalar;
      pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,local_28,local_24);
      VVar2.m_data[1] = 0.0;
      *pfVar1 = VVar2.m_data[0];
    }
  }
  MVar3.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar3.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar3.m_data.m_data[0].m_data[0] = VVar2.m_data[0];
  MVar3.m_data.m_data[0].m_data[1] = VVar2.m_data[1];
  return (Matrix<float,_2,_2>)MVar3.m_data.m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator+ (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) + scalar;
	return res;
}